

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O0

int gladLoadGLUserPtr(GLADuserptrloadfunc load,void *userptr)

{
  int iVar1;
  GLubyte *pGVar2;
  int version;
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString",userptr);
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      load_local._4_4_ = find_coreGL();
      load_GL_VERSION_1_0(load,userptr);
      load_GL_VERSION_1_1(load,userptr);
      load_GL_VERSION_1_2(load,userptr);
      load_GL_VERSION_1_3(load,userptr);
      load_GL_VERSION_1_4(load,userptr);
      load_GL_VERSION_1_5(load,userptr);
      load_GL_VERSION_2_0(load,userptr);
      load_GL_VERSION_2_1(load,userptr);
      load_GL_VERSION_3_0(load,userptr);
      load_GL_VERSION_3_1(load,userptr);
      load_GL_VERSION_3_2(load,userptr);
      load_GL_VERSION_3_3(load,userptr);
      load_GL_VERSION_4_0(load,userptr);
      load_GL_VERSION_4_1(load,userptr);
      load_GL_VERSION_4_2(load,userptr);
      load_GL_VERSION_4_3(load,userptr);
      load_GL_VERSION_4_4(load,userptr);
      load_GL_VERSION_4_5(load,userptr);
      load_GL_VERSION_4_6(load,userptr);
      iVar1 = find_extensionsGL(load_local._4_4_);
      if (iVar1 == 0) {
        load_local._4_4_ = 0;
      }
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLUserPtr( GLADuserptrloadfunc load, void *userptr) {
    int version;

    glGetString = (PFNGLGETSTRINGPROC) load("glGetString", userptr);
    if(glGetString == NULL) return 0;
    if(glGetString(GL_VERSION) == NULL) return 0;
    version = find_coreGL();

    load_GL_VERSION_1_0(load, userptr);
    load_GL_VERSION_1_1(load, userptr);
    load_GL_VERSION_1_2(load, userptr);
    load_GL_VERSION_1_3(load, userptr);
    load_GL_VERSION_1_4(load, userptr);
    load_GL_VERSION_1_5(load, userptr);
    load_GL_VERSION_2_0(load, userptr);
    load_GL_VERSION_2_1(load, userptr);
    load_GL_VERSION_3_0(load, userptr);
    load_GL_VERSION_3_1(load, userptr);
    load_GL_VERSION_3_2(load, userptr);
    load_GL_VERSION_3_3(load, userptr);
    load_GL_VERSION_4_0(load, userptr);
    load_GL_VERSION_4_1(load, userptr);
    load_GL_VERSION_4_2(load, userptr);
    load_GL_VERSION_4_3(load, userptr);
    load_GL_VERSION_4_4(load, userptr);
    load_GL_VERSION_4_5(load, userptr);
    load_GL_VERSION_4_6(load, userptr);

    if (!find_extensionsGL(version)) return 0;



    return version;
}